

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamFtp::SendCommand(BamFtp *this,string *command,bool waitForReply)

{
  bool bVar1;
  int64_t iVar2;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  bVar1 = TcpSocket::IsConnected(this->m_commandSocket);
  if (bVar1) {
    iVar2 = WriteCommandSocket(this,(command->_M_dataplus)._M_p,(uint)command->_M_string_length);
    if (iVar2 != -1) {
      if (!waitForReply) {
        return true;
      }
      bVar1 = ReceiveReply(this);
      return bVar1;
    }
    std::__cxx11::string::string((string *)&local_38,"BamFtp::SendCommand",&local_59);
    std::__cxx11::string::string((string *)&local_58,"error writing to socket",&local_5a);
    IBamIODevice::SetErrorString(&this->super_IBamIODevice,&local_38,&local_58);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,"BamFtp::SendCommand",&local_59);
    std::__cxx11::string::string((string *)&local_58,"command socket not connected",&local_5a);
    IBamIODevice::SetErrorString(&this->super_IBamIODevice,&local_38,&local_58);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return false;
}

Assistant:

bool BamFtp::SendCommand(const string& command, bool waitForReply) {

    // failure if not connected
    if ( !m_commandSocket->IsConnected() ) {
        SetErrorString("BamFtp::SendCommand", "command socket not connected");
        return false;
    }

    // write command to 'command socket'
    if ( WriteCommandSocket(command.c_str(), command.length()) == -1 ) {
        SetErrorString("BamFtp::SendCommand", "error writing to socket");
        // get actual error from command socket??
        return false;
    }

    // if we sent a command that receives a response
    if ( waitForReply )
        return ReceiveReply();

    // return success
    return true;
}